

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void tricore_tcg_init(uc_struct_conflict15 *uc)

{
  TCGContext_conflict9 *pTVar1;
  TCGContext_conflict9 *pTVar2;
  TCGTemp *pTVar3;
  TCGContext_conflict9 *tcg_ctx;
  long lVar4;
  
  pTVar1 = uc->tcg_ctx;
  lVar4 = 0;
  do {
    pTVar2 = uc->tcg_ctx;
    pTVar3 = tcg_global_mem_new_internal_tricore
                       (pTVar2,TCG_TYPE_I32,pTVar1->cpu_env,lVar4,
                        (char *)((long)&regnames_a_rel +
                                (long)*(int *)((long)&regnames_a_rel + lVar4)));
    *(long *)((long)pTVar1->cpu_gpr_a + lVar4 * 2) = (long)pTVar3 - (long)pTVar2;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x40);
  lVar4 = 0;
  do {
    pTVar2 = uc->tcg_ctx;
    pTVar3 = tcg_global_mem_new_internal_tricore
                       (pTVar2,TCG_TYPE_I32,pTVar1->cpu_env,lVar4 + 0x40,
                        (char *)((long)&regnames_d_rel +
                                (long)*(int *)((long)&regnames_d_rel + lVar4)));
    *(long *)((long)pTVar1->cpu_gpr_d + lVar4 * 2) = (long)pTVar3 - (long)pTVar2;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x40);
  pTVar2 = uc->tcg_ctx;
  pTVar3 = tcg_global_mem_new_internal_tricore(pTVar2,TCG_TYPE_I32,pTVar2->cpu_env,0x80,"PCXI");
  pTVar2->cpu_PCXI = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
  pTVar3 = tcg_global_mem_new_internal_tricore(pTVar2,TCG_TYPE_I32,pTVar2->cpu_env,0x84,"PSW");
  pTVar2->cpu_PSW = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
  pTVar3 = tcg_global_mem_new_internal_tricore(pTVar2,TCG_TYPE_I32,pTVar2->cpu_env,0x9c,"PC");
  pTVar2->cpu_PC = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
  pTVar3 = tcg_global_mem_new_internal_tricore(pTVar2,TCG_TYPE_I32,pTVar2->cpu_env,0xb8,"ICR");
  pTVar2->cpu_ICR = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
  pTVar2 = uc->tcg_ctx;
  pTVar3 = tcg_global_mem_new_internal_tricore(pTVar2,TCG_TYPE_I32,pTVar1->cpu_env,0x88,"PSW_C");
  pTVar1->cpu_PSW_C = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
  pTVar2 = uc->tcg_ctx;
  pTVar3 = tcg_global_mem_new_internal_tricore(pTVar2,TCG_TYPE_I32,pTVar1->cpu_env,0x8c,"PSW_V");
  pTVar1->cpu_PSW_V = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
  pTVar2 = uc->tcg_ctx;
  pTVar3 = tcg_global_mem_new_internal_tricore(pTVar2,TCG_TYPE_I32,pTVar1->cpu_env,0x90,"PSW_SV");
  pTVar1->cpu_PSW_SV = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
  pTVar2 = uc->tcg_ctx;
  pTVar3 = tcg_global_mem_new_internal_tricore(pTVar2,TCG_TYPE_I32,pTVar1->cpu_env,0x94,"PSW_AV");
  pTVar1->cpu_PSW_AV = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
  pTVar2 = uc->tcg_ctx;
  pTVar3 = tcg_global_mem_new_internal_tricore(pTVar2,TCG_TYPE_I32,pTVar1->cpu_env,0x98,"PSW_SAV");
  pTVar1->cpu_PSW_SAV = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
  return;
}

Assistant:

void tricore_tcg_init(struct uc_struct *uc)
{
    TCGContext *tcg_ctx = uc->tcg_ctx;
    int i;

    /* reg init */
    for (i = 0 ; i < 16 ; i++) {
        tcg_ctx->cpu_gpr_a[i] = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                          offsetof(CPUTriCoreState, gpr_a[i]),
                                          regnames_a[i]);
    }
    for (i = 0 ; i < 16 ; i++) {
        tcg_ctx->cpu_gpr_d[i] = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                           offsetof(CPUTriCoreState, gpr_d[i]),
                                           regnames_d[i]);
    }
    tricore_tcg_init_csfr(uc);
    /* init PSW flag cache */
    tcg_ctx->cpu_PSW_C = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                   offsetof(CPUTriCoreState, PSW_USB_C),
                                   "PSW_C");
    tcg_ctx->cpu_PSW_V = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                   offsetof(CPUTriCoreState, PSW_USB_V),
                                   "PSW_V");
    tcg_ctx->cpu_PSW_SV = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                    offsetof(CPUTriCoreState, PSW_USB_SV),
                                    "PSW_SV");
    tcg_ctx->cpu_PSW_AV = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                    offsetof(CPUTriCoreState, PSW_USB_AV),
                                    "PSW_AV");
    tcg_ctx->cpu_PSW_SAV = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                     offsetof(CPUTriCoreState, PSW_USB_SAV),
                                     "PSW_SAV");
}